

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::Picker::_q_dataChanged(Picker *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  PickerPrivate *pPVar4;
  bool local_99;
  QAccessibleEvent local_98 [8];
  QAccessibleEvent event;
  undefined1 local_68 [8];
  QString text;
  QModelIndex local_38;
  QModelIndex *local_20;
  QModelIndex *bottomRight_local;
  QModelIndex *topLeft_local;
  Picker *this_local;
  
  local_20 = bottomRight;
  bottomRight_local = topLeft;
  topLeft_local = (QModelIndex *)this;
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  local_99 = true;
  if ((pPVar4->inserting & 1U) == 0) {
    QModelIndex::parent(&local_38,bottomRight_local);
    QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
    operator->(&this->d);
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&text.d.size);
    local_99 = QModelIndex::operator!=(&local_38,(QModelIndex *)&text.d.size);
  }
  if (local_99 != false) {
    return;
  }
  QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
  operator->(&this->d);
  iVar2 = QPersistentModelIndex::row();
  iVar3 = QModelIndex::row(bottomRight_local);
  if (iVar3 <= iVar2) {
    QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
    operator->(&this->d);
    iVar2 = QPersistentModelIndex::row();
    iVar3 = QModelIndex::row(local_20);
    if (iVar2 <= iVar3) {
      QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
      operator->(&this->d);
      iVar2 = QPersistentModelIndex::row();
      itemText((QString *)local_68,this,iVar2);
      currentTextChanged(this,(QString *)local_68);
      QWidget::update();
      QString::~QString((QString *)local_68);
      goto LAB_001f4230;
    }
  }
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  bVar1 = PickerPrivate::isIndexesVisible(pPVar4,bottomRight_local,local_20);
  if (bVar1) {
    QWidget::update();
  }
LAB_001f4230:
  QAccessibleEvent::QAccessibleEvent(local_98,(QObject *)this,NameChanged);
  QAccessible::updateAccessibility((QAccessibleEvent *)local_98);
  QAccessibleEvent::~QAccessibleEvent(local_98);
  return;
}

Assistant:

void
Picker::_q_dataChanged( const QModelIndex & topLeft,
	const QModelIndex & bottomRight )
{
	if( d->inserting || topLeft.parent() != d->root )
		return;

	if( d->currentIndex.row() >= topLeft.row() &&
		d->currentIndex.row() <= bottomRight.row() )
	{
		const QString text = itemText( d->currentIndex.row() );

		emit currentTextChanged( text );

		update();
	}
	else if( d->isIndexesVisible( topLeft, bottomRight ) )
		update();

#ifndef QT_NO_ACCESSIBILITY
	QAccessibleEvent event( this, QAccessible::NameChanged );
	QAccessible::updateAccessibility( &event );
#endif
}